

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

char * __thiscall
spirv_cross::CompilerGLSL::flags_to_qualifiers_glsl(CompilerGLSL *this,SPIRType *type,Bitset *flags)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  char *pcVar5;
  SPIREntryPoint *pSVar6;
  bool bVar7;
  key_type local_1c;
  
  local_1c = 0x14eb;
  sVar4 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(flags->higher)._M_h,&local_1c);
  if (sVar4 == 0) {
    uVar1 = *(uint *)&(type->super_IVariant).field_0xc;
    pcVar5 = "";
    if ((uVar1 < 0x13) && ((0x72180U >> (uVar1 & 0x1f) & 1) != 0)) {
      if ((this->options).es == true) {
        pSVar6 = Compiler::get_entry_point(&this->super_Compiler);
        iVar2 = *(int *)&(type->super_IVariant).field_0xc;
        if ((flags->lower & 1) == 0) {
          if (iVar2 == 0xd) {
            bVar7 = pSVar6->model != ExecutionModelFragment ||
                    (this->options).fragment.default_float_precision == Highp;
          }
          else {
            bVar7 = false;
          }
          if (iVar2 - 7U < 2) {
            bVar3 = pSVar6->model != ExecutionModelFragment ||
                    (this->options).fragment.default_int_precision == Highp;
          }
          else {
            bVar3 = false;
          }
          bVar7 = (bool)(bVar7 | bVar3);
          pcVar5 = "highp ";
        }
        else {
          bVar7 = false;
          if ((iVar2 == 0xd) &&
             (bVar7 = false, (this->options).fragment.default_float_precision == Mediump)) {
            bVar7 = pSVar6->model == ExecutionModelFragment;
          }
          bVar3 = false;
          if ((iVar2 - 7U < 2) &&
             (bVar3 = false, (this->options).fragment.default_int_precision == Mediump)) {
            bVar3 = pSVar6->model == ExecutionModelFragment;
          }
          bVar7 = (bool)(bVar7 | bVar3);
          pcVar5 = "mediump ";
        }
        if (bVar7) {
          pcVar5 = "";
        }
      }
      else if (((this->backend).allow_precision_qualifiers == true) &&
              (pcVar5 = "mediump ", (flags->lower & 1) == 0)) {
        pcVar5 = "";
      }
    }
  }
  else {
    pcVar5 = "restrict ";
  }
  return pcVar5;
}

Assistant:

const char *CompilerGLSL::flags_to_qualifiers_glsl(const SPIRType &type, const Bitset &flags)
{
	// GL_EXT_buffer_reference variables can be marked as restrict.
	if (flags.get(DecorationRestrictPointerEXT))
		return "restrict ";

	// Structs do not have precision qualifiers, neither do doubles (desktop only anyways, so no mediump/highp).
	if (type.basetype != SPIRType::Float && type.basetype != SPIRType::Int && type.basetype != SPIRType::UInt &&
	    type.basetype != SPIRType::Image && type.basetype != SPIRType::SampledImage &&
	    type.basetype != SPIRType::Sampler)
		return "";

	if (options.es)
	{
		auto &execution = get_entry_point();

		if (flags.get(DecorationRelaxedPrecision))
		{
			bool implied_fmediump = type.basetype == SPIRType::Float &&
			                        options.fragment.default_float_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			bool implied_imediump = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                        options.fragment.default_int_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			return implied_fmediump || implied_imediump ? "" : "mediump ";
		}
		else
		{
			bool implied_fhighp =
			    type.basetype == SPIRType::Float && ((options.fragment.default_float_precision == Options::Highp &&
			                                          execution.model == ExecutionModelFragment) ||
			                                         (execution.model != ExecutionModelFragment));

			bool implied_ihighp = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                      ((options.fragment.default_int_precision == Options::Highp &&
			                        execution.model == ExecutionModelFragment) ||
			                       (execution.model != ExecutionModelFragment));

			return implied_fhighp || implied_ihighp ? "" : "highp ";
		}
	}
	else if (backend.allow_precision_qualifiers)
	{
		// Vulkan GLSL supports precision qualifiers, even in desktop profiles, which is convenient.
		// The default is highp however, so only emit mediump in the rare case that a shader has these.
		if (flags.get(DecorationRelaxedPrecision))
			return "mediump ";
		else
			return "";
	}
	else
		return "";
}